

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

void __thiscall
QItemDelegate::doLayout
          (QItemDelegate *this,QStyleOptionViewItem *option,QRect *checkRect,QRect *pixmapRect,
          QRect *textRect,bool hint)

{
  QRect *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QWidget *this_00;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  QStyle *pQVar13;
  int iVar14;
  Representation RVar15;
  int iVar16;
  int iVar17;
  Representation RVar18;
  Representation RVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  Representation RVar25;
  Representation RVar26;
  Representation RVar27;
  long in_FS_OFFSET;
  QRect QVar28;
  QSize local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = option->widget;
  if (this_00 == (QWidget *)0x0) {
    pQVar13 = QApplication::style();
  }
  else {
    pQVar13 = QWidget::style(this_00);
  }
  bVar5 = (checkRect->x1).m_i <= (checkRect->x2).m_i;
  bVar6 = (checkRect->y1).m_i <= (checkRect->y2).m_i;
  iVar16 = (pixmapRect->x1).m_i;
  iVar12 = (pixmapRect->x2).m_i;
  bVar7 = (pixmapRect->y1).m_i <= (pixmapRect->y2).m_i;
  iVar23 = (textRect->x1).m_i;
  iVar2 = (textRect->y1).m_i;
  iVar3 = (textRect->x2).m_i;
  iVar4 = (textRect->y2).m_i;
  if (((bVar6 && bVar5) || (bVar7 && iVar16 <= iVar12)) || (iVar2 <= iVar4 && iVar23 <= iVar3)) {
    iVar9 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x41,0,this_00);
    iVar9 = iVar9 + 1;
    iVar10 = (textRect->x1).m_i;
    iVar24 = (textRect->y1).m_i;
    iVar11 = (textRect->x2).m_i;
    iVar14 = (textRect->y2).m_i;
  }
  else {
    iVar9 = 0;
    iVar10 = iVar23;
    iVar11 = iVar3;
    iVar14 = iVar4;
    iVar24 = iVar2;
  }
  iVar17 = 0;
  iVar21 = 0;
  if (iVar2 <= iVar4 && iVar23 <= iVar3) {
    iVar21 = iVar9;
  }
  pQVar1 = &(option->super_QStyleOption).rect;
  RVar19.m_i = (pQVar1->x1).m_i;
  RVar18.m_i = (option->super_QStyleOption).rect.y1.m_i;
  puVar8 = *(undefined1 **)pQVar1;
  (textRect->x1).m_i = iVar10 - iVar21;
  (textRect->x2).m_i = iVar21 + iVar11;
  if ((!hint || (!bVar7 || iVar16 > iVar12)) && (iVar14 + 1 == iVar24)) {
    iVar10 = QFontMetrics::height();
    iVar24 = (textRect->y1).m_i;
    iVar14 = iVar10 + iVar24 + -1;
    (textRect->y2).m_i = iVar14;
  }
  iVar10 = 0;
  if (bVar7 && iVar16 <= iVar12) {
    iVar10 = ((pixmapRect->y2).m_i - (pixmapRect->y1).m_i) + 1;
    iVar17 = (((pixmapRect->x2).m_i + iVar9 * 2) - (pixmapRect->x1).m_i) + 1;
  }
  if (hint) {
    iVar21 = ((checkRect->y2).m_i - (checkRect->y1).m_i) + 1;
    iVar11 = (iVar14 - iVar24) + 1;
    if (iVar11 <= iVar10) {
      iVar11 = iVar10;
    }
    if (iVar11 < iVar21) {
      iVar11 = iVar21;
    }
    iVar21 = (textRect->x1).m_i;
    iVar22 = (textRect->x2).m_i;
    if (option->decorationPosition < Top) {
      iVar21 = ((iVar22 + iVar17) - iVar21) + 1;
    }
    else {
      iVar21 = (iVar22 - iVar21) + 1;
      if (iVar21 <= iVar17) {
        iVar21 = iVar17;
      }
    }
  }
  else {
    iVar21 = ((option->super_QStyleOption).rect.x2.m_i - (option->super_QStyleOption).rect.x1.m_i) +
             1;
    iVar11 = ((option->super_QStyleOption).rect.y2.m_i - (option->super_QStyleOption).rect.y1.m_i) +
             1;
  }
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  iVar22 = 0;
  if (bVar6 && bVar5) {
    iVar22 = ((iVar9 * 2 + (checkRect->x2).m_i) - (checkRect->x1).m_i) + 1;
    iVar20 = 0;
    if (hint) {
      iVar20 = iVar22;
    }
    iVar21 = iVar20 + iVar21;
    iVar20 = iVar22;
    local_48.x1.m_i = RVar19.m_i;
    if ((option->super_QStyleOption).direction == RightToLeft) {
      iVar20 = iVar21;
      local_48.x1.m_i = (iVar21 + RVar19.m_i) - iVar22;
    }
    local_48.y1.m_i = RVar18.m_i;
    local_48.y2.m_i = RVar18.m_i + iVar11 + -1;
    local_48.x2.m_i = iVar20 + RVar19.m_i + -1;
  }
  local_58.x1.m_i = 0;
  local_58.y1.m_i = 0;
  local_58.x2.m_i = -1;
  local_58.y2.m_i = -1;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  switch(option->decorationPosition) {
  case Left:
    if ((option->super_QStyleOption).direction == LeftToRight) {
      iVar12 = RVar19.m_i + iVar22;
      local_68 = (undefined1 *)CONCAT44(RVar18.m_i,iVar12);
      RVar15.m_i = RVar18.m_i + iVar11 + -1;
      uStack_60 = (undefined1 *)CONCAT44(RVar15.m_i,iVar12 + iVar17 + -1);
      RVar19.m_i = iVar12 + iVar17;
      local_58.y1.m_i = RVar18.m_i;
      local_58.x1.m_i = RVar19.m_i;
      RVar26.m_i = (iVar21 - (iVar22 + iVar17)) + RVar19.m_i + -1;
      local_58.y2.m_i = RVar15.m_i;
      local_58.x2.m_i = RVar26.m_i;
    }
    else {
      iVar21 = iVar21 - (iVar22 + iVar17);
      RVar26.m_i = iVar21 + RVar19.m_i + -1;
      RVar15.m_i = RVar18.m_i + iVar11 + -1;
      local_58.y2.m_i = RVar15.m_i;
      local_58.x2.m_i = RVar26.m_i;
LAB_005585a3:
      local_58.y1.m_i = RVar18.m_i;
      local_58.x1.m_i = RVar19.m_i;
      local_68 = (undefined1 *)CONCAT44(RVar18.m_i,iVar21 + RVar19.m_i);
      uStack_60 = (undefined1 *)CONCAT44(RVar15.m_i,iVar21 + RVar19.m_i + iVar17 + -1);
    }
    break;
  case Right:
    if ((option->super_QStyleOption).direction == LeftToRight) {
      RVar19.m_i = RVar19.m_i + iVar22;
      iVar21 = iVar21 - (iVar22 + iVar17);
      RVar26.m_i = iVar21 + RVar19.m_i + -1;
      RVar15.m_i = RVar18.m_i + iVar11 + -1;
      local_58.y2.m_i = RVar15.m_i;
      local_58.x2.m_i = RVar26.m_i;
      goto LAB_005585a3;
    }
    iVar12 = RVar19.m_i + -1;
    RVar15.m_i = RVar18.m_i + iVar11 + -1;
    uStack_60 = (undefined1 *)CONCAT44(RVar15.m_i,RVar19.m_i + iVar17 + -1);
    RVar19.m_i = iVar17 + RVar19.m_i;
    local_58.y1.m_i = RVar18.m_i;
    local_58.x1.m_i = RVar19.m_i;
    RVar26.m_i = (iVar12 - iVar22) + iVar21;
    local_58.y2.m_i = RVar15.m_i;
    local_58.x2.m_i = RVar26.m_i;
    local_68 = puVar8;
    break;
  case Top:
    iVar23 = 0;
    if (bVar7 && iVar16 <= iVar12) {
      iVar23 = iVar9;
    }
    iVar10 = iVar10 + iVar23;
    iVar12 = iVar11 - iVar10;
    if (hint) {
      iVar12 = (iVar14 - iVar24) + 1;
    }
    if ((option->super_QStyleOption).direction == RightToLeft) {
      RVar26.m_i = RVar19.m_i + (iVar21 - iVar22) + -1;
      uStack_60 = (undefined1 *)CONCAT44(iVar10 + RVar18.m_i + -1,RVar26.m_i);
    }
    else {
      RVar19.m_i = RVar19.m_i + iVar22;
      RVar26.m_i = (iVar21 - iVar22) + RVar19.m_i + -1;
      uStack_60 = (undefined1 *)CONCAT44(iVar10 + RVar18.m_i + -1,RVar26.m_i);
    }
    local_68 = (undefined1 *)CONCAT44(RVar18.m_i,RVar19.m_i);
    RVar18.m_i = iVar10 + RVar18.m_i;
    local_58.y1.m_i = RVar18.m_i;
    local_58.x1.m_i = RVar19.m_i;
    RVar15.m_i = iVar12 + RVar18.m_i + -1;
    local_58.y2.m_i = RVar15.m_i;
    local_58.x2.m_i = RVar26.m_i;
    break;
  case Bottom:
    if (iVar2 <= iVar4 && iVar23 <= iVar3) {
      iVar14 = iVar14 + iVar9;
      (textRect->y2).m_i = iVar14;
    }
    if (hint) {
      iVar11 = ((iVar10 + iVar14) - iVar24) + 1;
    }
    if ((option->super_QStyleOption).direction == RightToLeft) {
      iVar14 = iVar14 - iVar24;
      RVar26.m_i = RVar19.m_i + (iVar21 - iVar22) + -1;
      RVar15.m_i = iVar14 + RVar18.m_i;
      local_58.y2.m_i = RVar15.m_i;
      local_58.x2.m_i = RVar26.m_i;
    }
    else {
      RVar19.m_i = RVar19.m_i + iVar22;
      iVar14 = iVar14 - iVar24;
      RVar26.m_i = (iVar21 - iVar22) + RVar19.m_i + -1;
      RVar15.m_i = iVar14 + RVar18.m_i;
      local_58.y2.m_i = RVar15.m_i;
      local_58.x2.m_i = RVar26.m_i;
    }
    local_58.y1.m_i = RVar18.m_i;
    local_58.x1.m_i = RVar19.m_i;
    local_68 = (undefined1 *)CONCAT44(RVar15.m_i + 1,RVar19.m_i);
    uStack_60 = (undefined1 *)CONCAT44(iVar11 + ~(iVar14 + 1U) + RVar15.m_i + 1,RVar26.m_i);
    break;
  default:
    doLayout();
    RVar15.m_i = -1;
    RVar18.m_i = 0;
    RVar19.m_i = 0;
    RVar26.m_i = -1;
  }
  if (hint) {
    checkRect->x1 = (Representation)local_48.x1.m_i;
    checkRect->y1 = (Representation)local_48.y1.m_i;
    checkRect->x2 = (Representation)local_48.x2.m_i;
    checkRect->y2 = (Representation)local_48.y2.m_i;
    *(undefined1 **)pixmapRect = local_68;
    *(undefined1 **)&pixmapRect->x2 = uStack_60;
  }
  else {
    local_70.wd.m_i = ((checkRect->x2).m_i - (checkRect->x1).m_i) + 1;
    local_70.ht.m_i = ((checkRect->y2).m_i - (checkRect->y1).m_i) + 1;
    QVar28 = QStyle::alignedRect((option->super_QStyleOption).direction,(Alignment)0x84,&local_70,
                                 &local_48);
    *checkRect = QVar28;
    local_70.wd.m_i = ((pixmapRect->x2).m_i - (pixmapRect->x1).m_i) + 1;
    local_70.ht.m_i = ((pixmapRect->y2).m_i - (pixmapRect->y1).m_i) + 1;
    QVar28 = QStyle::alignedRect((option->super_QStyleOption).direction,
                                 (Alignment)
                                 (option->decorationAlignment).
                                 super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                 super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_70,
                                 (QRect *)&local_68);
    *pixmapRect = QVar28;
    if (option->showDecorationSelected != true) {
      iVar12 = ((textRect->x2).m_i - (textRect->x1).m_i) + 1;
      iVar16 = ((textRect->y2).m_i - (textRect->y1).m_i) + 1;
      RVar27.m_i = (RVar26.m_i - RVar19.m_i) + 1;
      RVar25.m_i = (RVar15.m_i - RVar18.m_i) + 1;
      if (iVar12 < RVar27.m_i) {
        RVar27.m_i = iVar12;
      }
      if (iVar16 < RVar25.m_i) {
        RVar25.m_i = iVar16;
      }
      local_70.ht.m_i = RVar25.m_i;
      local_70.wd.m_i = RVar27.m_i;
      QVar28 = QStyle::alignedRect((option->super_QStyleOption).direction,
                                   (Alignment)
                                   (option->displayAlignment).
                                   super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                   super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_70,&local_58);
      *textRect = QVar28;
      goto LAB_005586cf;
    }
  }
  (textRect->x1).m_i = local_58.x1.m_i;
  (textRect->y1).m_i = local_58.y1.m_i;
  (textRect->x2).m_i = local_58.x2.m_i;
  (textRect->y2).m_i = local_58.y2.m_i;
LAB_005586cf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemDelegate::doLayout(const QStyleOptionViewItem &option,
                             QRect *checkRect, QRect *pixmapRect, QRect *textRect,
                             bool hint) const
{
    Q_ASSERT(checkRect && pixmapRect && textRect);
    Q_D(const QItemDelegate);
    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    const bool hasCheck = checkRect->isValid();
    const bool hasPixmap = pixmapRect->isValid();
    const bool hasText = textRect->isValid();
    const bool hasMargin = (hasText | hasPixmap | hasCheck);
    const int frameHMargin = hasMargin ?
                style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, widget) + 1 : 0;
    const int textMargin = hasText ? frameHMargin : 0;
    const int pixmapMargin = hasPixmap ? frameHMargin : 0;
    const int checkMargin = hasCheck ? frameHMargin : 0;
    const int x = option.rect.left();
    const int y = option.rect.top();
    int w, h;

    textRect->adjust(-textMargin, 0, textMargin, 0); // add width padding
    if (textRect->height() == 0 && (!hasPixmap || !hint)) {
        //if there is no text, we still want to have a decent height for the item sizeHint and the editor size
        textRect->setHeight(option.fontMetrics.height());
    }

    QSize pm(0, 0);
    if (hasPixmap) {
        pm = pixmapRect->size();
        pm.rwidth() += 2 * pixmapMargin;
    }
    if (hint) {
        h = qMax(checkRect->height(), qMax(textRect->height(), pm.height()));
        if (option.decorationPosition == QStyleOptionViewItem::Left
            || option.decorationPosition == QStyleOptionViewItem::Right) {
            w = textRect->width() + pm.width();
        } else {
            w = qMax(textRect->width(), pm.width());
        }
    } else {
        w = option.rect.width();
        h = option.rect.height();
    }

    int cw = 0;
    QRect check;
    if (hasCheck) {
        cw = checkRect->width() + 2 * checkMargin;
        if (hint) w += cw;
        if (option.direction == Qt::RightToLeft) {
            check.setRect(x + w - cw, y, cw, h);
        } else {
            check.setRect(x, y, cw, h);
        }
    }

    // at this point w should be the *total* width

    QRect display;
    QRect decoration;
    switch (option.decorationPosition) {
    case QStyleOptionViewItem::Top: {
        if (hasPixmap)
            pm.setHeight(pm.height() + pixmapMargin); // add space
        h = hint ? textRect->height() : h - pm.height();

        if (option.direction == Qt::RightToLeft) {
            decoration.setRect(x, y, w - cw, pm.height());
            display.setRect(x, y + pm.height(), w - cw, h);
        } else {
            decoration.setRect(x + cw, y, w - cw, pm.height());
            display.setRect(x + cw, y + pm.height(), w - cw, h);
        }
        break; }
    case QStyleOptionViewItem::Bottom: {
        if (hasText)
            textRect->setHeight(textRect->height() + textMargin); // add space
        h = hint ? textRect->height() + pm.height() : h;

        if (option.direction == Qt::RightToLeft) {
            display.setRect(x, y, w - cw, textRect->height());
            decoration.setRect(x, y + textRect->height(), w - cw, h - textRect->height());
        } else {
            display.setRect(x + cw, y, w - cw, textRect->height());
            decoration.setRect(x + cw, y + textRect->height(), w - cw, h - textRect->height());
        }
        break; }
    case QStyleOptionViewItem::Left: {
        if (option.direction == Qt::LeftToRight) {
            decoration.setRect(x + cw, y, pm.width(), h);
            display.setRect(decoration.right() + 1, y, w - pm.width() - cw, h);
        } else {
            display.setRect(x, y, w - pm.width() - cw, h);
            decoration.setRect(display.right() + 1, y, pm.width(), h);
        }
        break; }
    case QStyleOptionViewItem::Right: {
        if (option.direction == Qt::LeftToRight) {
            display.setRect(x + cw, y, w - pm.width() - cw, h);
            decoration.setRect(display.right() + 1, y, pm.width(), h);
        } else {
            decoration.setRect(x, y, pm.width(), h);
            display.setRect(decoration.right() + 1, y, w - pm.width() - cw, h);
        }
        break; }
    default:
        qWarning("doLayout: decoration position is invalid");
        decoration = *pixmapRect;
        break;
    }

    if (!hint) { // we only need to do the internal layout if we are going to paint
        *checkRect = QStyle::alignedRect(option.direction, Qt::AlignCenter,
                                         checkRect->size(), check);
        *pixmapRect = QStyle::alignedRect(option.direction, option.decorationAlignment,
                                          pixmapRect->size(), decoration);
        // the text takes up all available space, unless the decoration is not shown as selected
        if (option.showDecorationSelected)
            *textRect = display;
        else
            *textRect = QStyle::alignedRect(option.direction, option.displayAlignment,
                                            textRect->size().boundedTo(display.size()), display);
    } else {
        *checkRect = check;
        *pixmapRect = decoration;
        *textRect = display;
    }
}